

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void qt_init_tooltip_palette(void)

{
  QPalette *pQVar1;
  long in_FS_OFFSET;
  undefined1 local_28 [24];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QPalette *)
           (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x50))
                     (QGuiApplicationPrivate::platform_theme,1);
  if (pQVar1 != (QPalette *)0x0) {
    local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPalette::QPalette((QPalette *)local_28,pQVar1);
    QPalette::setResolveMask((ulonglong)local_28);
    QToolTip::setPalette((QHash<QByteArray,_QFont> *)local_28);
    QPalette::~QPalette((QPalette *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_init_tooltip_palette()
{
#if QT_CONFIG(tooltip)
    if (const QPalette *toolTipPalette = QGuiApplicationPrivate::platformTheme()->palette(QPlatformTheme::ToolTipPalette)) {
        QPalette toolTipPal = *toolTipPalette;
        toolTipPal.setResolveMask(0);
        QToolTip::setPalette(toolTipPal);
    }
#endif
}